

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QList<QUrl> *
QFileDialog::getOpenFileUrls
          (QList<QUrl> *__return_storage_ptr__,QWidget *parent,QString *caption,QUrl *dir,
          QString *filter,QString *selectedFilter,Options options,QStringList *supportedSchemes)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  QObject *this;
  long in_FS_OFFSET;
  bool bVar5;
  QFileDialogArgs args;
  QString local_c8;
  QAutoPointer<QFileDialog> local_a8;
  undefined1 local_98 [92];
  Options OStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileDialogArgs::QFileDialogArgs((QFileDialogArgs *)local_98,dir);
  local_98._0_8_ = parent;
  QString::operator=((QString *)(local_98 + 8),(QString *)caption);
  QString::operator=((QString *)(local_98 + 0x40),(QString *)filter);
  OStack_3c = (Options)(Options)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                                super_QFlagsStorage<QFileDialog::Option>.i;
  local_98._88_4_ = ExistingFiles;
  local_a8.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QObject *)operator_new(0x28);
  QFileDialog((QFileDialog *)this,(QFileDialogArgs *)local_98);
  local_a8.o.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(this);
  local_a8.o.wp.value = this;
  QFileDialogOptions::setSupportedSchemes(*(QList_conflict **)(*(long *)(this + 8) + 0x3d0));
  if ((selectedFilter != (QString *)0x0) && ((selectedFilter->d).size != 0)) {
    selectNameFilter((QFileDialog *)local_a8.o.wp.value,selectedFilter);
  }
  iVar4 = (**(code **)(*(long *)local_a8.o.wp.value + 0x1a8))();
  if ((local_a8.o.wp.d == (Data *)0x0) || (*(int *)(local_a8.o.wp.d + 4) == 0)) {
    bVar5 = false;
  }
  else {
    bVar5 = local_a8.o.wp.value != (QObject *)0x0;
  }
  if ((iVar4 == 1) && (bVar5)) {
    if (selectedFilter != (QString *)0x0) {
      selectedNameFilter(&local_c8,(QFileDialog *)local_a8.o.wp.value);
      pQVar1 = &((selectedFilter->d).d)->super_QArrayData;
      pcVar2 = (selectedFilter->d).ptr;
      (selectedFilter->d).d = local_c8.d.d;
      (selectedFilter->d).ptr = local_c8.d.ptr;
      qVar3 = (selectedFilter->d).size;
      (selectedFilter->d).size = local_c8.d.size;
      local_c8.d.d = (Data *)pQVar1;
      local_c8.d.ptr = pcVar2;
      local_c8.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    selectedUrls(__return_storage_ptr__,(QFileDialog *)local_a8.o.wp.value);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QAutoPointer<QFileDialog>::~QAutoPointer(&local_a8);
  if ((QArrayData *)local_98._64_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._64_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._64_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._64_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._64_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._40_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._40_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._40_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._40_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._40_8_,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)(local_98 + 0x20));
  if ((QArrayData *)local_98._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._8_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QFileDialog::getOpenFileUrls(QWidget *parent,
                                         const QString &caption,
                                         const QUrl &dir,
                                         const QString &filter,
                                         QString *selectedFilter,
                                         Options options,
                                         const QStringList &supportedSchemes)
{
    QFileDialogArgs args(dir);
    args.parent = parent;
    args.caption = caption;
    args.filter = filter;
    args.mode = ExistingFiles;
    args.options = options;

    QAutoPointer<QFileDialog> dialog(new QFileDialog(args));
    dialog->setSupportedSchemes(supportedSchemes);
    if (selectedFilter && !selectedFilter->isEmpty())
        dialog->selectNameFilter(*selectedFilter);
    const int execResult = dialog->exec();
    if (bool(dialog) && execResult == QDialog::Accepted) {
        if (selectedFilter)
            *selectedFilter = dialog->selectedNameFilter();
        return dialog->selectedUrls();
    }
    return QList<QUrl>();
}